

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::genTextures(GLContext *this,int numTextures,deUint32 *textures)

{
  deUint32 *textures_local;
  int numTextures_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glGenTextures(this->m_wrapper,numTextures,textures);
  if (0 < numTextures) {
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<unsigned_int*>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_allocatedTextures,textures,textures + numTextures);
  }
  return;
}

Assistant:

void GLContext::genTextures (int numTextures, deUint32* textures)
{
	m_wrapper->glGenTextures(numTextures, textures);
	if (numTextures > 0)
		m_allocatedTextures.insert(textures, textures+numTextures);
}